

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int verify_descriptor_wpkh(miniscript_node_t *node,miniscript_node_t *parent)

{
  _Bool _Var1;
  int32_t iVar2;
  int iVar3;
  
  iVar3 = -2;
  if ((((parent == (miniscript_node_t *)0x0) ||
       ((parent->info != (miniscript_item_t *)0x0 && ((parent->info->kind & 1) == 0)))) &&
      (iVar2 = get_child_list_count(node), iVar2 == node->info->inner_num)) &&
     ((node->child->info == (miniscript_item_t *)0x0 && ((node->child->kind & 0x20) != 0)))) {
    for (; parent != (miniscript_node_t *)0x0; parent = parent->parent) {
      if (parent->kind == 0x20002) {
        return -2;
      }
    }
    _Var1 = has_uncompressed_key_by_child(node);
    iVar3 = (uint)!_Var1 * 2 + -2;
  }
  return iVar3;
}

Assistant:

static int verify_descriptor_wpkh(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    struct miniscript_node_t *parent_item = parent;
    if (parent && (!parent->info || (parent->info->kind & DESCRIPTOR_KIND_MINISCRIPT)))
        return WALLY_EINVAL;
    if ((get_child_list_count(node) != node->info->inner_num) || node->child->info ||
        ((node->child->kind & DESCRIPTOR_KIND_KEY) != DESCRIPTOR_KIND_KEY))
        return WALLY_EINVAL;

    while (parent_item != NULL) {
        if (parent_item->kind == DESCRIPTOR_KIND_DESCRIPTOR_WSH)
            return WALLY_EINVAL;
        parent_item = parent_item->parent;
    }

    if (has_uncompressed_key_by_child(node))
        return WALLY_EINVAL;

    return WALLY_OK;
}